

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O2

void __thiscall Dinic_Capacities_Test::Dinic_Capacities_Test(Dinic_Capacities_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00152f48;
  return;
}

Assistant:

TEST(Dinic, Capacities) {
    // We construct a graph where it is necessary to consider residual capacities
    Dinic d(8);
    vector<vector<int>> edges = {
        {0, 1, 1},
        {1, 2, 1},
        {2, 3, 1},
        {0, 4, 2},
        {4, 5, 2},
        {5, 2, 2},
        {2, 1, 1}, // the important reverse edge
        {1, 6, 2},
        {6, 7, 2},
        {7, 3, 2},
    };
    for (auto &e : edges) {
        d.addEdge(e[0], e[1], e[2]);
    }
    
    EXPECT_EQ(d.getFlow(0, 3), 3);
}